

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserAnimation.cpp
# Opt level: O2

bool Rml::PropertyParserAnimation::ParseAnimation(Property *property,StringList *animation_values)

{
  pointer pbVar1;
  bool bVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  NodePtr pDVar6;
  PropertyParserAnimationData *pPVar7;
  byte bVar8;
  pointer key;
  bool bVar9;
  pointer string;
  const_iterator cVar10;
  byte local_139;
  int count;
  StringList arguments;
  AnimationList animation_list;
  Animation animation;
  vector<Rml::Animation,_std::allocator<Rml::Animation>_> local_98;
  float number;
  
  animation_list.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  animation_list.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  animation_list.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  string = (animation_values->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (animation_values->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (string == pbVar1) {
      Variant::operator=(&property->value,&animation_list);
      property->unit = ANIMATION;
      bVar8 = 1;
      break;
    }
    Animation::Animation(&animation);
    arguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    arguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    arguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    StringUtilities::ExpandString(&arguments,string,' ');
    pbVar3 = arguments.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar9 = false;
    bVar4 = false;
    bVar2 = false;
    for (key = arguments.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; key != pbVar3; key = key + 1) {
      if (key->_M_string_length == 0) goto LAB_002aff1c;
      this = &ControlledLifetimeResource<Rml::PropertyParserAnimationData>::operator->
                        ((ControlledLifetimeResource<Rml::PropertyParserAnimationData> *)
                         &parser_data)->keywords;
      cVar10 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(this,key);
      pDVar6 = cVar10.mKeyVals;
      pPVar7 = ControlledLifetimeResource<Rml::PropertyParserAnimationData>::operator->
                         ((ControlledLifetimeResource<Rml::PropertyParserAnimationData> *)
                          &parser_data);
      if (pDVar6 == (NodePtr)(pPVar7->keywords).mInfo) {
switchD_002afe2f_caseD_2:
        number = 0.0;
        count = 0;
        iVar5 = __isoc99_sscanf((key->_M_dataplus)._M_p,"%fs%n",&number,&count);
        if (iVar5 == 1) {
          if (count < 1) {
            if (!bVar2) {
              animation.num_iterations = Math::RoundToInteger(number);
              goto LAB_002aff05;
            }
            goto LAB_002aff77;
          }
          if (bVar9) {
            if (bVar4) goto LAB_002aff77;
            animation.delay = number;
            bVar9 = true;
            bVar4 = true;
          }
          else {
            animation.duration = number;
            bVar9 = true;
          }
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)&animation.name);
        }
      }
      else {
        switch((pDVar6->mData).second.type) {
        case None:
          if (animation_list.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              animation_list.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>.
              _M_impl.super__Vector_impl_data._M_start) goto LAB_002aff9d;
          local_98.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Property::Property<std::vector<Rml::Animation,std::allocator<Rml::Animation>>>
                    ((Property *)&number,&local_98,ANIMATION,-1);
          Property::operator=(property,(Property *)&number);
          Property::~Property((Property *)&number);
          ::std::vector<Rml::Animation,_std::allocator<Rml::Animation>_>::~vector(&local_98);
          bVar8 = 1;
          bVar4 = false;
          goto LAB_002aff9f;
        case Tween:
          animation.tween.type_in = (pDVar6->mData).second.tween.type_in;
          animation.tween.type_out = (pDVar6->mData).second.tween.type_out;
          animation.tween.callback._0_4_ = *(undefined4 *)&(pDVar6->mData).second.tween.callback;
          animation.tween.callback._4_4_ =
               *(undefined4 *)((long)&(pDVar6->mData).second.tween.callback + 4);
          break;
        default:
          goto switchD_002afe2f_caseD_2;
        case Alternate:
          animation.alternate = true;
          break;
        case Infinite:
          if (bVar2) goto LAB_002aff77;
          animation.num_iterations = -1;
LAB_002aff05:
          bVar2 = true;
          break;
        case Paused:
          animation.paused = true;
        }
      }
LAB_002aff1c:
    }
    bVar4 = false;
    if (animation.name._M_string_length == 0) {
LAB_002aff77:
      bVar4 = false;
      bVar8 = 0;
    }
    else if ((animation.duration <= 0.0) || (animation.num_iterations < -1)) {
LAB_002aff9d:
      bVar4 = false;
      bVar8 = 0;
    }
    else {
      bVar8 = 0;
      if (animation.num_iterations != 0) {
        bVar4 = true;
        ::std::vector<Rml::Animation,_std::allocator<Rml::Animation>_>::emplace_back<Rml::Animation>
                  (&animation_list,&animation);
        bVar8 = local_139;
      }
    }
LAB_002aff9f:
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&arguments);
    ::std::__cxx11::string::~string((string *)&animation.name);
    string = string + 1;
    local_139 = bVar8;
  } while (bVar4);
  ::std::vector<Rml::Animation,_std::allocator<Rml::Animation>_>::~vector(&animation_list);
  return (bool)(bVar8 & 1);
}

Assistant:

bool PropertyParserAnimation::ParseAnimation(Property& property, const StringList& animation_values)
{
	AnimationList animation_list;

	for (const String& single_animation_value : animation_values)
	{
		Animation animation;

		StringList arguments;
		StringUtilities::ExpandString(arguments, single_animation_value, ' ');

		bool duration_found = false;
		bool delay_found = false;
		bool num_iterations_found = false;

		for (auto& argument : arguments)
		{
			if (argument.empty())
				continue;

			// See if we have a <keyword> or <tween> specifier as defined in keywords
			auto it = parser_data->keywords.find(argument);
			if (it != parser_data->keywords.end() && it->second.ValidAnimation())
			{
				switch (it->second.type)
				{
				case KeywordType::None:
				{
					if (animation_list.size() > 0) // The none keyword can not be part of multiple definitions
						return false;
					property = Property{AnimationList{}, Unit::ANIMATION};
					return true;
				}
				break;
				case KeywordType::Tween: animation.tween = it->second.tween; break;
				case KeywordType::Alternate: animation.alternate = true; break;
				case KeywordType::Infinite:
					if (num_iterations_found)
						return false;
					animation.num_iterations = -1;
					num_iterations_found = true;
					break;
				case KeywordType::Paused: animation.paused = true; break;
				default: break;
				}
			}
			else
			{
				// Either <duration>, <delay>, <num_iterations> or a <keyframes-name>
				float number = 0.0f;
				int count = 0;

				if (sscanf(argument.c_str(), "%fs%n", &number, &count) == 1)
				{
					// Found a number, if there was an 's' unit, count will be positive
					if (count > 0)
					{
						// Duration or delay was assigned
						if (!duration_found)
						{
							duration_found = true;
							animation.duration = number;
						}
						else if (!delay_found)
						{
							delay_found = true;
							animation.delay = number;
						}
						else
							return false;
					}
					else
					{
						// No 's' unit means num_iterations was found
						if (!num_iterations_found)
						{
							animation.num_iterations = Math::RoundToInteger(number);
							num_iterations_found = true;
						}
						else
							return false;
					}
				}
				else
				{
					// Must be an animation name
					animation.name = argument;
				}
			}
		}

		// Validate the parsed transition
		if (animation.name.empty() || animation.duration <= 0.0f || (animation.num_iterations < -1 || animation.num_iterations == 0))
		{
			return false;
		}

		animation_list.push_back(std::move(animation));
	}

	property.value = std::move(animation_list);
	property.unit = Unit::ANIMATION;

	return true;
}